

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 uVar7;
  NodeRef *pNVar8;
  long lVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  uint uVar13;
  size_t sVar14;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar15;
  bool bVar16;
  vfloat_impl<4> __tmp_1;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar21;
  undefined1 auVar22 [64];
  float fVar23;
  float fVar27;
  float fVar28;
  vfloat_impl<4> __tmp;
  float fVar29;
  undefined1 auVar24 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar25;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar26;
  vint4 ai_2;
  undefined1 auVar30 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  undefined1 in_ZMM3 [64];
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 ai_3;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi_1;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_3;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  vint4 ai;
  undefined1 auVar49 [16];
  vint4 bi_2;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  Precalculations pre;
  undefined1 local_1788 [16];
  vbool<4> valid_leaf;
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  undefined1 local_1708 [16];
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar24 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    auVar30 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar24);
    iVar4 = vmovmskps_avx(auVar30);
    uVar5 = CONCAT44((int)((ulong)context >> 0x20),iVar4);
    if (iVar4 != 0) {
      auVar33 = *(undefined1 (*) [16])(ray + 0x40);
      auVar18._8_4_ = 0x7fffffff;
      auVar18._0_8_ = 0x7fffffff7fffffff;
      auVar18._12_4_ = 0x7fffffff;
      auVar34 = vandps_avx(auVar33,auVar18);
      auVar32._8_4_ = 0x219392ef;
      auVar32._0_8_ = 0x219392ef219392ef;
      auVar32._12_4_ = 0x219392ef;
      auVar34 = vcmpps_avx(auVar34,auVar32,1);
      auVar53 = vblendvps_avx(auVar33,auVar32,auVar34);
      auVar34 = *(undefined1 (*) [16])(ray + 0x50);
      auVar46 = vandps_avx(auVar34,auVar18);
      auVar46 = vcmpps_avx(auVar46,auVar32,1);
      auVar35 = vblendvps_avx(auVar34,auVar32,auVar46);
      auVar46 = *(undefined1 (*) [16])(ray + 0x60);
      auVar18 = vandps_avx(auVar46,auVar18);
      auVar18 = vcmpps_avx(auVar18,auVar32,1);
      auVar18 = vblendvps_avx(auVar46,auVar32,auVar18);
      auVar32 = vrcpps_avx(auVar53);
      local_1718 = auVar32._0_4_;
      auVar19._0_4_ = auVar53._0_4_ * local_1718;
      fStack_1714 = auVar32._4_4_;
      auVar19._4_4_ = auVar53._4_4_ * fStack_1714;
      fStack_1710 = auVar32._8_4_;
      auVar19._8_4_ = auVar53._8_4_ * fStack_1710;
      fStack_170c = auVar32._12_4_;
      auVar19._12_4_ = auVar53._12_4_ * fStack_170c;
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar43,auVar19);
      auVar53 = vrcpps_avx(auVar35);
      local_1728 = auVar53._0_4_;
      auVar20._0_4_ = auVar35._0_4_ * local_1728;
      fStack_1724 = auVar53._4_4_;
      auVar20._4_4_ = auVar35._4_4_ * fStack_1724;
      fStack_1720 = auVar53._8_4_;
      auVar20._8_4_ = auVar35._8_4_ * fStack_1720;
      fStack_171c = auVar53._12_4_;
      auVar20._12_4_ = auVar35._12_4_ * fStack_171c;
      auVar35 = vsubps_avx(auVar43,auVar20);
      auVar53 = vrcpps_avx(auVar18);
      fVar56 = auVar53._0_4_;
      auVar50._0_4_ = auVar18._0_4_ * fVar56;
      fVar57 = auVar53._4_4_;
      auVar50._4_4_ = auVar18._4_4_ * fVar57;
      fVar58 = auVar53._8_4_;
      auVar50._8_4_ = auVar18._8_4_ * fVar58;
      fVar59 = auVar53._12_4_;
      auVar50._12_4_ = auVar18._12_4_ * fVar59;
      auVar18 = vsubps_avx(auVar43,auVar50);
      auVar19 = ZEXT816(0);
      auVar33 = vcmpps_avx(auVar33,auVar19,1);
      auVar53._8_4_ = 1;
      auVar53._0_8_ = 0x100000001;
      auVar53._12_4_ = 1;
      auVar33 = vandps_avx(auVar53,auVar33);
      auVar34 = vcmpps_avx(auVar34,auVar19,1);
      auVar54._8_4_ = 2;
      auVar54._0_8_ = 0x200000002;
      auVar54._12_4_ = 2;
      auVar34 = vandps_avx(auVar34,auVar54);
      auVar34 = vorps_avx(auVar34,auVar33);
      auVar53 = *(undefined1 (*) [16])ray;
      auVar33 = vcmpps_avx(auVar46,auVar19,1);
      auVar46._8_4_ = 4;
      auVar46._0_8_ = 0x400000004;
      auVar46._12_4_ = 4;
      auVar33 = vandps_avx(auVar46,auVar33);
      auVar46 = *(undefined1 (*) [16])(ray + 0x10);
      auVar55 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar24 = vpor_avx(auVar30 ^ auVar24,auVar33);
      local_1738 = vpor_avx(auVar24,auVar34);
      do {
        lVar9 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar7 = *(undefined4 *)(local_1738 + lVar9 * 4);
        auVar24._4_4_ = uVar7;
        auVar24._0_4_ = uVar7;
        auVar24._8_4_ = uVar7;
        auVar24._12_4_ = uVar7;
        auVar24 = vpcmpeqd_avx(auVar24,local_1738);
        uVar7 = vmovmskps_avx(auVar24);
        uVar5 = uVar5 & ~CONCAT44((int)((ulong)lVar9 >> 0x20),uVar7);
      } while (uVar5 != 0);
      local_1738 = vpcmpeqd_avx(local_1738,local_1738);
      auVar30 = vpcmpeqd_avx(local_1738,(undefined1  [16])valid_i->field_0);
      local_1718 = local_1718 + auVar32._0_4_ * local_1718;
      fStack_1714 = fStack_1714 + auVar32._4_4_ * fStack_1714;
      fStack_1710 = fStack_1710 + auVar32._8_4_ * fStack_1710;
      fStack_170c = fStack_170c + auVar32._12_4_ * fStack_170c;
      local_1728 = auVar35._0_4_ * local_1728 + local_1728;
      fStack_1724 = auVar35._4_4_ * fStack_1724 + fStack_1724;
      fStack_1720 = auVar35._8_4_ * fStack_1720 + fStack_1720;
      fStack_171c = auVar35._12_4_ * fStack_171c + fStack_171c;
      auVar24 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16e8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar24,auVar30);
      auVar24 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      auVar33._8_4_ = 0xff800000;
      auVar33._0_8_ = 0xff800000ff800000;
      auVar33._12_4_ = 0xff800000;
      local_1788 = vblendvps_avx(auVar33,auVar24,auVar30);
      local_16f8 = fVar56 + auVar18._0_4_ * fVar56;
      fStack_16f4 = fVar57 + auVar18._4_4_ * fVar57;
      fStack_16f0 = fVar58 + auVar18._8_4_ * fVar58;
      fStack_16ec = fVar59 + auVar18._12_4_ * fVar59;
      pNVar8 = stack_node + 2;
      paVar15 = &stack_near[2].field_0;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = local_16e8;
      auVar51 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar52 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      local_1708 = *(undefined1 (*) [16])(ray + 0x20);
      fVar56 = local_1718;
      fVar57 = fStack_1714;
      fVar58 = fStack_1710;
      fVar59 = fStack_170c;
      fVar60 = local_1728;
      fVar61 = fStack_1724;
      fVar62 = fStack_1720;
      fVar63 = fStack_171c;
LAB_00ed1dff:
      sVar14 = pNVar8[-1].ptr;
      if (sVar14 != 0xfffffffffffffff8) {
        pNVar8 = pNVar8 + -1;
        paVar1 = paVar15 + -1;
        auVar17 = ZEXT1664((undefined1  [16])*paVar1);
        paVar15 = paVar15 + -1;
        auVar24 = vcmpps_avx((undefined1  [16])*paVar1,local_1788,1);
        if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar24[0xf] < '\0') {
          while( true ) {
            uVar13 = (uint)sVar14;
            if ((sVar14 & 8) != 0) break;
            uVar6 = sVar14 & 0xfffffffffffffff0;
            auVar22 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar5 = 0;
            sVar14 = 8;
            for (lVar9 = -0x10;
                (aVar21 = auVar22._0_16_, lVar9 != 0 &&
                (sVar11 = *(size_t *)(uVar6 + 0x20 + lVar9 * 2), sVar11 != 8)); lVar9 = lVar9 + 4) {
              fVar2 = *(float *)(uVar6 + 0x90 + lVar9);
              fVar3 = *(float *)(uVar6 + 0x30 + lVar9);
              auVar24 = *(undefined1 (*) [16])(ray + 0x70);
              fVar23 = auVar24._0_4_;
              fVar27 = auVar24._4_4_;
              fVar28 = auVar24._8_4_;
              fVar29 = auVar24._12_4_;
              auVar30._0_4_ = fVar23 * fVar2 + fVar3;
              auVar30._4_4_ = fVar27 * fVar2 + fVar3;
              auVar30._8_4_ = fVar28 * fVar2 + fVar3;
              auVar30._12_4_ = fVar29 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar6 + 0xb0 + lVar9);
              fVar3 = *(float *)(uVar6 + 0x50 + lVar9);
              auVar34._0_4_ = fVar23 * fVar2 + fVar3;
              auVar34._4_4_ = fVar27 * fVar2 + fVar3;
              auVar34._8_4_ = fVar28 * fVar2 + fVar3;
              auVar34._12_4_ = fVar29 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar6 + 0xd0 + lVar9);
              fVar3 = *(float *)(uVar6 + 0x70 + lVar9);
              auVar37._0_4_ = fVar23 * fVar2 + fVar3;
              auVar37._4_4_ = fVar27 * fVar2 + fVar3;
              auVar37._8_4_ = fVar28 * fVar2 + fVar3;
              auVar37._12_4_ = fVar29 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar6 + 0xa0 + lVar9);
              fVar3 = *(float *)(uVar6 + 0x40 + lVar9);
              auVar40._0_4_ = fVar23 * fVar2 + fVar3;
              auVar40._4_4_ = fVar27 * fVar2 + fVar3;
              auVar40._8_4_ = fVar28 * fVar2 + fVar3;
              auVar40._12_4_ = fVar29 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar6 + 0xc0 + lVar9);
              fVar3 = *(float *)(uVar6 + 0x60 + lVar9);
              auVar44._0_4_ = fVar3 + fVar23 * fVar2;
              auVar44._4_4_ = fVar3 + fVar27 * fVar2;
              auVar44._8_4_ = fVar3 + fVar28 * fVar2;
              auVar44._12_4_ = fVar3 + fVar29 * fVar2;
              fVar2 = *(float *)(uVar6 + 0xe0 + lVar9);
              fVar3 = *(float *)(uVar6 + 0x80 + lVar9);
              auVar47._0_4_ = fVar2 * fVar23 + fVar3;
              auVar47._4_4_ = fVar2 * fVar27 + fVar3;
              auVar47._8_4_ = fVar2 * fVar28 + fVar3;
              auVar47._12_4_ = fVar2 * fVar29 + fVar3;
              auVar30 = vsubps_avx(auVar30,auVar51._0_16_);
              auVar49._0_4_ = fVar56 * auVar30._0_4_;
              auVar49._4_4_ = fVar57 * auVar30._4_4_;
              auVar49._8_4_ = fVar58 * auVar30._8_4_;
              auVar49._12_4_ = fVar59 * auVar30._12_4_;
              auVar30 = vsubps_avx(auVar34,auVar52._0_16_);
              auVar35._0_4_ = fVar60 * auVar30._0_4_;
              auVar35._4_4_ = fVar61 * auVar30._4_4_;
              auVar35._8_4_ = fVar62 * auVar30._8_4_;
              auVar35._12_4_ = fVar63 * auVar30._12_4_;
              auVar30 = vsubps_avx(auVar37,auVar55._0_16_);
              auVar38._0_4_ = local_16f8 * auVar30._0_4_;
              auVar38._4_4_ = fStack_16f4 * auVar30._4_4_;
              auVar38._8_4_ = fStack_16f0 * auVar30._8_4_;
              auVar38._12_4_ = fStack_16ec * auVar30._12_4_;
              auVar30 = vsubps_avx(auVar40,auVar51._0_16_);
              auVar41._0_4_ = fVar56 * auVar30._0_4_;
              auVar41._4_4_ = fVar57 * auVar30._4_4_;
              auVar41._8_4_ = fVar58 * auVar30._8_4_;
              auVar41._12_4_ = fVar59 * auVar30._12_4_;
              auVar30 = vsubps_avx(auVar44,auVar52._0_16_);
              auVar45._0_4_ = fVar60 * auVar30._0_4_;
              auVar45._4_4_ = fVar61 * auVar30._4_4_;
              auVar45._8_4_ = fVar62 * auVar30._8_4_;
              auVar45._12_4_ = fVar63 * auVar30._12_4_;
              auVar30 = vsubps_avx(auVar47,auVar55._0_16_);
              auVar48._0_4_ = local_16f8 * auVar30._0_4_;
              auVar48._4_4_ = fStack_16f4 * auVar30._4_4_;
              auVar48._8_4_ = fStack_16f0 * auVar30._8_4_;
              auVar48._12_4_ = fStack_16ec * auVar30._12_4_;
              auVar30 = vpminsd_avx(auVar49,auVar41);
              auVar33 = vpminsd_avx(auVar35,auVar45);
              auVar30 = vpmaxsd_avx(auVar30,auVar33);
              auVar33 = vpminsd_avx(auVar38,auVar48);
              auVar30 = vpmaxsd_avx(auVar30,auVar33);
              auVar33 = vpmaxsd_avx(auVar49,auVar41);
              auVar34 = vpmaxsd_avx(auVar35,auVar45);
              auVar34 = vpminsd_avx(auVar33,auVar34);
              auVar33 = vpmaxsd_avx(auVar38,auVar48);
              auVar33 = vpminsd_avx(auVar33,local_1788);
              auVar34 = vpminsd_avx(auVar34,auVar33);
              auVar33 = vpmaxsd_avx(auVar30,(undefined1  [16])local_16e8);
              if ((uVar13 & 7) == 6) {
                auVar33 = vcmpps_avx(auVar33,auVar34,2);
                uVar7 = *(undefined4 *)(uVar6 + 0xf0 + lVar9);
                auVar39._4_4_ = uVar7;
                auVar39._0_4_ = uVar7;
                auVar39._8_4_ = uVar7;
                auVar39._12_4_ = uVar7;
                auVar34 = vcmpps_avx(auVar39,auVar24,2);
                uVar7 = *(undefined4 *)(uVar6 + 0x100 + lVar9);
                auVar42._4_4_ = uVar7;
                auVar42._0_4_ = uVar7;
                auVar42._8_4_ = uVar7;
                auVar42._12_4_ = uVar7;
                auVar24 = vcmpps_avx(auVar24,auVar42,1);
                auVar24 = vandps_avx(auVar34,auVar24);
                auVar24 = vandps_avx(auVar24,auVar33);
              }
              else {
                auVar24 = vcmpps_avx(auVar33,auVar34,2);
              }
              auVar33 = vcmpps_avx(local_1788,auVar17._0_16_,6);
              auVar24 = vandps_avx(auVar24,auVar33);
              auVar24 = vpslld_avx(auVar24,0x1f);
              if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar24[0xf] < '\0') {
                auVar36._8_4_ = 0x7f800000;
                auVar36._0_8_ = 0x7f8000007f800000;
                auVar36._12_4_ = 0x7f800000;
                aVar31 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar36,auVar30,auVar24);
                auVar24 = vcmpps_avx((undefined1  [16])aVar31,(undefined1  [16])aVar21,1);
                sVar10 = sVar14;
                sVar12 = sVar11;
                aVar26 = aVar31;
                if (((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar24[0xf]) ||
                   (sVar10 = sVar11, sVar12 = sVar14, aVar26 = aVar21, aVar21 = aVar31, sVar14 != 8)
                   ) {
                  aVar31 = aVar21;
                  uVar5 = uVar5 + 1;
                  pNVar8->ptr = sVar12;
                  pNVar8 = pNVar8 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar15->v = aVar26;
                  paVar15 = paVar15 + 1;
                  sVar11 = sVar10;
                }
                auVar22 = ZEXT1664((undefined1  [16])aVar31);
                sVar14 = sVar11;
              }
            }
            if (sVar14 == 8) goto LAB_00ed1dff;
            auVar17 = ZEXT1664((undefined1  [16])aVar21);
            if (1 < uVar5) {
              aVar31 = paVar15[-2];
              aVar26 = paVar15[-1];
              auVar24 = vcmpps_avx((undefined1  [16])aVar31,(undefined1  [16])aVar26,1);
              aVar25 = aVar26;
              if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar24[0xf] < '\0') {
                paVar15[-2] = aVar26;
                paVar15[-1] = aVar31;
                auVar24 = vpermilps_avx(*(undefined1 (*) [16])(pNVar8 + -2),0x4e);
                *(undefined1 (*) [16])(pNVar8 + -2) = auVar24;
                aVar25 = aVar31;
                aVar31 = aVar26;
              }
              auVar17 = ZEXT1664((undefined1  [16])aVar21);
              if (uVar5 != 2) {
                aVar26 = paVar15[-3];
                auVar24 = vcmpps_avx((undefined1  [16])aVar26,(undefined1  [16])aVar25,1);
                if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar24[0xf] < '\0') {
                  paVar15[-3] = aVar25;
                  paVar15[-1] = aVar26;
                  sVar11 = pNVar8[-3].ptr;
                  pNVar8[-3].ptr = pNVar8[-1].ptr;
                  pNVar8[-1].ptr = sVar11;
                  aVar26 = aVar25;
                }
                auVar24 = vcmpps_avx((undefined1  [16])aVar26,(undefined1  [16])aVar31,1);
                auVar17 = ZEXT1664((undefined1  [16])aVar21);
                if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar24[0xf] < '\0') {
                  paVar15[-3] = aVar31;
                  paVar15[-2] = aVar26;
                  auVar24 = vpermilps_avx(*(undefined1 (*) [16])(pNVar8 + -3),0x4e);
                  *(undefined1 (*) [16])(pNVar8 + -3) = auVar24;
                  auVar17 = ZEXT1664((undefined1  [16])aVar21);
                }
              }
            }
          }
          if (sVar14 == 0xfffffffffffffff8) {
            return;
          }
          valid_leaf.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
               vcmpps_avx(local_1788,auVar17._0_16_,6);
          if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0 ||
               ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
               (undefined1  [16])0x0) ||
              ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
            lVar9 = (ulong)(uVar13 & 0xf) - 8;
            prim = (Primitive_conflict4 *)(sVar14 & 0xfffffffffffffff0);
            while (bVar16 = lVar9 != 0, lVar9 = lVar9 + -1, bVar16) {
              InstanceArrayIntersectorKMB<4>::intersect(&valid_leaf,&pre,ray,context,prim);
              auVar55 = ZEXT1664(local_1708);
              prim = prim + 1;
            }
            local_1788 = vblendvps_avx(local_1788,*(undefined1 (*) [16])(ray + 0x80),
                                       (undefined1  [16])valid_leaf.field_0);
            auVar51 = ZEXT1664(auVar53);
            auVar52 = ZEXT1664(auVar46);
            fVar56 = local_1718;
            fVar57 = fStack_1714;
            fVar58 = fStack_1710;
            fVar59 = fStack_170c;
            fVar60 = local_1728;
            fVar61 = fStack_1724;
            fVar62 = fStack_1720;
            fVar63 = fStack_171c;
          }
        }
        goto LAB_00ed1dff;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }